

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<45UL> * __thiscall GF2::WW<45UL>::ShHi(WW<45UL> *this,size_t shift)

{
  ulong uVar1;
  sbyte sVar2;
  ulong in_RSI;
  WW<45UL> *in_RDI;
  size_t pos;
  size_t wshift;
  ulong local_20;
  
  if (in_RSI < 0x2d) {
    uVar1 = in_RSI >> 6;
    if ((in_RSI & 0x3f) == 0) {
      for (local_20 = 0; uVar1 < local_20 + 1; local_20 = local_20 + -1) {
        in_RDI[local_20]._words[0] = in_RDI[local_20 - uVar1]._words[0];
      }
    }
    else {
      for (local_20 = 0; sVar2 = (sbyte)(in_RSI & 0x3f), uVar1 < local_20; local_20 = local_20 - 1)
      {
        in_RDI[local_20]._words[0] =
             in_RDI[local_20 - uVar1]._words[0] << sVar2 |
             in_RDI[(local_20 - uVar1) + -1]._words[0] >> (0x40U - sVar2 & 0x3f);
      }
      in_RDI[local_20]._words[0] = in_RDI[local_20 - uVar1]._words[0] << sVar2;
      local_20 = local_20 - 1;
    }
    Trim(in_RDI);
    while (local_20 != -1) {
      in_RDI[local_20]._words[0] = 0;
      local_20 = local_20 + -1;
    }
  }
  else {
    SetAllZero(in_RDI);
  }
  return in_RDI;
}

Assistant:

WW& ShHi(size_t shift)
	{	
		if (shift < _n)
		{
			size_t wshift = shift / B_PER_W, pos;
			// величина сдвига не кратна длине слова?
			if (shift %= B_PER_W)
			{
				// сдвиг всех слов, кроме первого
				for (pos = _wcount - 1; pos > wshift; --pos)
					_words[pos] = (_words[pos - wshift] << shift) |
						(_words[pos - wshift - 1] >> (B_PER_W - shift));
				// первое слово
				_words[pos] = _words[pos - wshift] << shift, --pos;
			}
			// величина сдвига кратна длине слова
			else for (pos = _wcount - 1; pos + 1 > wshift; --pos)
					_words[pos] = _words[pos - wshift];
			// очистка последнего слова
			Trim();
			// обнуление левых слов
			for (; pos != SIZE_MAX; _words[pos--] = 0);
		}
		else SetAllZero();
		return *this;
	}